

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::XSDDOMParser
          (XSDDOMParser *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  ValueVectorOf<unsigned_int> *this_00;
  
  XercesDOMParser::XercesDOMParser(&this->super_XercesDOMParser,valToAdopt,manager,gramPool);
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
  _vptr_XMLDocumentHandler = (_func_int **)&PTR__XSDDOMParser_00408470;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLErrorReporter.
  _vptr_XMLErrorReporter = (_func_int **)&PTR__XSDDOMParser_00408600;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLEntityHandler.
  _vptr_XMLEntityHandler = (_func_int **)&PTR__XSDDOMParser_00408630;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_DocTypeHandler._vptr_DocTypeHandler =
       (_func_int **)&PTR__XSDDOMParser_00408678;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_PSVIHandler._vptr_PSVIHandler =
       (_func_int **)&PTR__XSDDOMParser_00408718;
  this->fSawFatal = false;
  this->fAnnotationDepth = -1;
  this->fInnerAnnotationDepth = -1;
  this->fDepth = -1;
  this->fUserErrorReporter = (XMLErrorReporter *)0x0;
  this->fUserEntityHandler = (XMLEntityHandler *)0x0;
  this->fURIs = (ValueVectorOf<unsigned_int> *)0x0;
  XMLBuffer::XMLBuffer(&this->fAnnotationBuf,0x3ff,manager);
  XSDErrorReporter::XSDErrorReporter(&this->fXSDErrorReporter,(XMLErrorReporter *)0x0);
  XSDLocator::XSDLocator(&this->fXSLocator);
  this_00 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,manager);
  ValueVectorOf<unsigned_int>::ValueVectorOf(this_00,0x10,manager,false);
  this->fURIs = this_00;
  (this->fXSDErrorReporter).fErrorReporter =
       &(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLErrorReporter;
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this,true);
  return;
}

Assistant:

XSDDOMParser::XSDDOMParser( XMLValidator* const   valToAdopt
                          , MemoryManager* const  manager
                          , XMLGrammarPool* const gramPool):
    XercesDOMParser(valToAdopt, manager, gramPool)
    , fSawFatal(false)
    , fAnnotationDepth(-1)
    , fInnerAnnotationDepth(-1)
    , fDepth(-1)
    , fUserErrorReporter(0)
    , fUserEntityHandler(0)
    , fURIs(0)
    , fAnnotationBuf(1023, manager)

{
    fURIs = new (manager) ValueVectorOf<unsigned int>(16, manager);
    fXSDErrorReporter.setErrorReporter(this);
    setValidationScheme(XercesDOMParser::Val_Never);
    setDoNamespaces(true);
}